

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O2

void __thiscall Sequence::process_itemset(Sequence *this,Itemset_S *iset,uint templ,int iter)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  reference pvVar5;
  undefined4 in_register_0000000c;
  int iVar6;
  uint ptempl;
  EqGrNode *this_00;
  Sequence *pSVar7;
  undefined1 local_c8 [32];
  Itemset_S iset2;
  Itemset_S ljoin;
  Itemset_S ejoin;
  int esup;
  int lsup;
  Env *local_68;
  Env *local_60;
  element_type *local_58;
  __shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_c8._16_8_ = CONCAT44(in_register_0000000c,iter);
  peVar1 = (this->numLargeItemset).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((ulong)(long)iter <=
      (ulong)((long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2)) {
    local_68 = this->env;
    iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iVar4 = Itemset::operator[]((iset->super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr,0);
    peVar2 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar6 = (int)local_c8._16_8_;
    if (peVar2->maxiter < iVar6) {
      peVar2->maxiter = iVar6;
    }
    local_58 = (element_type *)((long)iVar4 * 0x10);
    this_00 = *(EqGrNode **)
               (&local_58->has_class +
               (long)(((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->eqgraph).
                     super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    if (this_00 != (EqGrNode *)0x0) {
      local_60 = (Env *)(long)(iVar6 + -1);
      local_c8._28_4_ = iVar6 + 1;
      iVar4 = 0;
      while( true ) {
        peVar3 = (this_00->theElements).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar6 = 0;
        if (peVar3 != (element_type *)0x0) {
          iVar6 = peVar3->theSize;
        }
        if (iVar6 <= iVar4) break;
        EqGrNode::get_element(this_00,iVar4);
        InvertDatabase::get_item
                  ((InvertDatabase *)local_c8,
                   (int)(this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
        std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
        local_c8._0_8_ = 0;
        local_c8._8_8_ = (pointer)0x0;
        std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
        prune_decision((Sequence *)local_c8,(Itemset_S *)this,
                       (Itemset_S *)&iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                       (uint)iset,templ);
        std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
        if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->pruning_type) {
          pre_pruning(this,(Itemset_S *)
                           &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,templ,iset
                      ,&iset2,'\0');
        }
        if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          pSVar7 = this;
          get_tmpnewf_intersect
                    (this,&ljoin,
                     (Itemset_S *)&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                     &ljoin,&lsup,&esup,&lsup,&iset2,iset,(int)local_c8._16_8_);
          if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            fill_join(pSVar7,(Itemset_S *)
                             &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,iset,
                      &iset2);
          }
        }
        if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->pruning_type) {
          post_pruning(this,(Itemset_S *)
                            &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,templ);
        }
        if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::at
                             ((this->numLargeItemset).
                              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,(size_type)local_60);
          *pvVar5 = *pvVar5 + 1;
          if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              outputfreq != '\0') {
            Itemset::print_seq(ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               (ostream *)local_68,templ);
          }
          std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_40,&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
          process_itemset(this,(Itemset_S *)&local_40,templ,local_c8._28_4_);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
          local_c8._0_8_ = 0;
          local_c8._8_8_ = (pointer)0x0;
          std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
        }
        iVar4 = iVar4 + 1;
        this_00 = *(EqGrNode **)
                   (&local_58->has_class +
                   (long)(((this->invdb).
                           super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         eqgraph).
                         super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      }
      ptempl = templ | 1 << ((int)local_c8._16_8_ - 2U & 0x1f);
      iVar4 = 0;
      while( true ) {
        peVar3 = (this_00->stheElements).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar6 = 0;
        if (peVar3 != (element_type *)0x0) {
          iVar6 = peVar3->theSize;
        }
        if (iVar6 <= iVar4) break;
        EqGrNode::seqget_element(this_00,iVar4);
        InvertDatabase::get_item
                  ((InvertDatabase *)local_c8,
                   (int)(this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
        std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
        local_c8._0_8_ = 0;
        local_c8._8_8_ = (pointer)0x0;
        std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
        prune_decision((Sequence *)local_c8,(Itemset_S *)this,
                       (Itemset_S *)&iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                       (uint)iset,ptempl);
        std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
        if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->pruning_type) {
          pre_pruning(this,(Itemset_S *)
                           &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,ptempl,
                      iset,&iset2,'\x01');
        }
        if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          pSVar7 = this;
          get_tmpnewf_intersect
                    (this,(Itemset_S *)
                          &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,&ejoin,
                     &ejoin,&lsup,&esup,&esup,&iset2,iset,(int)local_c8._16_8_);
          if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            fill_join(pSVar7,(Itemset_S *)
                             &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,iset,
                      &iset2);
          }
        }
        if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->pruning_type) {
          post_pruning(this,(Itemset_S *)
                            &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,ptempl);
        }
        if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::at
                             ((this->numLargeItemset).
                              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,(size_type)local_60);
          *pvVar5 = *pvVar5 + 1;
          if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              outputfreq != '\0') {
            Itemset::print_seq(ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               (ostream *)local_68,ptempl);
          }
          std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_50,&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
          process_itemset(this,(Itemset_S *)&local_50,ptempl,local_c8._28_4_);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
          local_c8._0_8_ = 0;
          local_c8._8_8_ = (pointer)0x0;
          std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
        }
        iVar4 = iVar4 + 1;
        this_00 = *(EqGrNode **)
                   (&local_58->has_class +
                   (long)(((this->invdb).
                           super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         eqgraph).
                         super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void Sequence::process_itemset(Itemset_S iset, unsigned int templ, int iter) {
    if (iter > numLargeItemset->size()) return;

    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    int i, it2;
    int lsup, esup;
    unsigned int ntpl;
    Itemset_S iset2, ejoin, ljoin;
    int it = (*iset)[0];
    if (args->maxiter < iter) args->maxiter = iter;
    if (invdb->get_eqgraph_item(it)) {
        for (i = 0; i < invdb->get_eqgraph_item(it)->num_elements(); i++) {
            it2 = invdb->get_eqgraph_item(it)->get_element(i);
            ntpl = templ;
            iset2 = invdb->get_item(it2);
            ljoin = nullptr;
            ejoin = prune_decision(iset2, iset, ntpl, EJOIN);
            if (args->pruning_type > 1) pre_pruning(ejoin, ntpl, iset, iset2, 0);
            if (ejoin) get_tmpnewf_intersect(ljoin, ejoin, ljoin, lsup, esup, lsup, iset2, iset, iter);
            if (ejoin) fill_join(ejoin, iset, iset2);
            if (args->pruning_type > 1) post_pruning(ejoin, ntpl);
            if (ejoin) {
                numLargeItemset->at(iter - 1)++;
                //fill_join(ejoin, iset, iset2);
                //if (iter > 3) ejoin->print_seq(seqstrm, ntpl);
                if (args->outputfreq) ejoin->print_seq(seqstrm, ntpl);
                process_itemset(ejoin, ntpl, iter + 1);
                ejoin = nullptr;
            }
        }

        for (i = 0; i < invdb->get_eqgraph_item(it)->seqnum_elements(); i++) {
            it2 = invdb->get_eqgraph_item(it)->seqget_element(i);
            ntpl = SETBIT(templ, 1, iter - 2);
            iset2 = invdb->get_item(it2);
            ejoin = nullptr;
            ljoin = prune_decision(iset2, iset, ntpl, LJOIN);
            if (args->pruning_type > 1) pre_pruning(ljoin, ntpl, iset, iset2, 1);
            if (ljoin) get_tmpnewf_intersect(ljoin, ejoin, ejoin, lsup, esup, esup, iset2, iset, iter);
            if (ljoin) fill_join(ljoin, iset, iset2);
            if (args->pruning_type > 1) post_pruning(ljoin, ntpl);
            if (ljoin) {
                numLargeItemset->at(iter - 1)++;
                //fill_join(ljoin, iset, iset2);
                //if (iter > 3) ljoin->print_seq(seqstrm, ntpl);
                if (args->outputfreq) ljoin->print_seq(seqstrm, ntpl);
                process_itemset(ljoin, ntpl, iter + 1);
                ljoin = nullptr;
            }
        }
    }
}